

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

void openjtalk_speakAsync(OpenJTalk *oj,char *text)

{
  OpenJTalk *in_RSI;
  long in_RDI;
  char *in_stack_ffffffffffffffe8;
  
  if (in_RDI == 0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else {
    openjtalk_stop((OpenJTalk *)0x19a1af);
    synthesisU8(in_RSI,in_stack_ffffffffffffffe8);
    speakasync((OpenJTalk *)0x19a1c8);
  }
  return;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_speakAsync(OpenJTalk *oj, const char *text)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return;
	}
	openjtalk_stop(oj);
	synthesisU8(oj, text);
	speakasync(oj);
}